

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::LeadingRegexp(Regexp *re)

{
  RegexpOp RVar1;
  int iVar2;
  Regexp **ppRVar3;
  Regexp **sub;
  Regexp *re_local;
  
  RVar1 = op(re);
  if (RVar1 == kRegexpEmptyMatch) {
    re_local = (Regexp *)0x0;
  }
  else {
    RVar1 = op(re);
    re_local = re;
    if ((RVar1 == kRegexpConcat) && (iVar2 = nsub(re), 1 < iVar2)) {
      ppRVar3 = Regexp::sub(re);
      RVar1 = op(*ppRVar3);
      if (RVar1 == kRegexpEmptyMatch) {
        re_local = (Regexp *)0x0;
      }
      else {
        re_local = *ppRVar3;
      }
    }
  }
  return re_local;
}

Assistant:

Regexp* Regexp::LeadingRegexp(Regexp* re) {
  if (re->op() == kRegexpEmptyMatch)
    return NULL;
  if (re->op() == kRegexpConcat && re->nsub() >= 2) {
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch)
      return NULL;
    return sub[0];
  }
  return re;
}